

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::Federate(Federate *this)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  __integral_type in_stack_ffffffffffffffec;
  
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__Federate_00a63798;
  std::atomic<helics::Federate::Modes>::atomic
            ((atomic<helics::Federate::Modes> *)
             ((in_RDI->super__Function_base)._M_functor._M_pod_data + 8),STARTUP);
  (in_RDI->super__Function_base)._M_functor._M_pod_data[9] = '/';
  (in_RDI->super__Function_base)._M_functor._M_pod_data[10] = '\x01';
  (in_RDI->super__Function_base)._M_functor._M_pod_data[0xb] = '\0';
  (in_RDI->super__Function_base)._M_functor._M_pod_data[0xc] = '\0';
  (in_RDI->super__Function_base)._M_functor._M_pod_data[0xd] = '\0';
  (in_RDI->super__Function_base)._M_functor._M_pod_data[0xe] = '\0';
  (in_RDI->super__Function_base)._M_functor._M_pod_data[0xf] = '\0';
  LocalFederateId::LocalFederateId((LocalFederateId *)&(in_RDI->super__Function_base)._M_manager);
  std::shared_ptr<helics::Core>::shared_ptr((shared_ptr<helics::Core> *)0x33e794);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::minVal();
  *(baseType *)((long)&in_RDI[1].super__Function_base._M_functor + 8) = TVar1.internalTimeCode;
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[1].super__Function_base._M_manager = (_Manager_type)TVar1.internalTimeCode;
  std::__cxx11::string::string(unaff_retaddr);
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>,std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>>>
  ::
  unique_ptr<std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>>,void>
            ((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
              *)in_RDI);
  std::
  unique_ptr<helics::ConnectorFederateManager,std::default_delete<helics::ConnectorFederateManager>>
  ::unique_ptr<std::default_delete<helics::ConnectorFederateManager>,void>
            ((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
              *)in_RDI);
  std::
  unique_ptr<helics::PotentialInterfacesManager,std::default_delete<helics::PotentialInterfacesManager>>
  ::unique_ptr<std::default_delete<helics::PotentialInterfacesManager>,void>
            ((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
              *)in_RDI);
  CLI::std::atomic<int>::atomic((atomic<int> *)in_RDI,in_stack_ffffffffffffffec);
  std::__cxx11::string::string(unaff_retaddr);
  std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  ::function(in_RDI);
  std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)in_RDI);
  std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::function
            ((function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)in_RDI);
  std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)in_RDI);
  std::function<void_(bool)>::function((function<void_(bool)> *)in_RDI);
  CLI::std::function<void_()>::function((function<void_()> *)in_RDI);
  CLI::std::function<void_()>::function((function<void_()> *)in_RDI);
  std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::function
            ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)in_RDI);
  return;
}

Assistant:

Federate::Federate() noexcept
{
    // this function needs to be defined for the virtual inheritance to compile but shouldn't
    // actually be executed
}